

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::execute
          (DuplicateRowsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  undefined4 *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  pointer pnVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  byte bVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int32_t iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  VarStatus *pVVar22;
  VarStatus VVar23;
  ulong uVar24;
  long lVar25;
  VarStatus *pVVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_b8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  if ((this->m_isLast == true) && (lVar20 = (long)(this->m_perm).thesize, 0 < lVar20)) {
    uVar24 = lVar20 + 1;
    lVar20 = lVar20 * 0xe + -2;
    do {
      lVar25 = (long)(this->m_perm).data[uVar24 - 2];
      if (-1 < lVar25) {
        pnVar4 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar20 * 4 + -0x10) =
             *(undefined8 *)((long)&pnVar4[lVar25].m_backend.data + 0x20);
        uVar7 = *(undefined8 *)&pnVar4[lVar25].m_backend.data;
        uVar15 = *(undefined8 *)((long)&pnVar4[lVar25].m_backend.data + 8);
        puVar2 = (uint *)((long)&pnVar4[lVar25].m_backend.data + 0x10);
        uVar16 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar20 * 4 + -0x20);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar16;
        puVar3 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar20 * 4 + -0x30);
        *puVar3 = uVar7;
        puVar3[1] = uVar15;
        *(int *)((long)&(pnVar4->m_backend).data + lVar20 * 4 + -8) = pnVar4[lVar25].m_backend.exp;
        *(bool *)((long)&(pnVar4->m_backend).data + lVar20 * 4 + -4) = pnVar4[lVar25].m_backend.neg;
        *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar20 * 4) =
             *(undefined8 *)&pnVar4[lVar25].m_backend.fpclass;
        pnVar5 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x10) =
             *(undefined8 *)((long)&pnVar5[lVar25].m_backend.data + 0x20);
        pnVar4 = pnVar5 + lVar25;
        uVar10 = (pnVar4->m_backend).data._M_elems[0];
        uVar11 = *(uint *)((long)&(pnVar4->m_backend).data + 4);
        uVar12 = *(uint *)((long)&(pnVar4->m_backend).data + 8);
        uVar13 = *(uint *)((long)&(pnVar4->m_backend).data + 0xc);
        puVar2 = (uint *)((long)&pnVar5[lVar25].m_backend.data + 0x10);
        uVar7 = *(undefined8 *)(puVar2 + 2);
        puVar3 = (undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x20);
        *puVar3 = *(undefined8 *)puVar2;
        puVar3[1] = uVar7;
        puVar1 = (undefined4 *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -0x30);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1[2] = uVar12;
        puVar1[3] = uVar13;
        *(int *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -8) = pnVar5[lVar25].m_backend.exp;
        *(bool *)((long)&(pnVar5->m_backend).data + lVar20 * 4 + -4) = pnVar5[lVar25].m_backend.neg;
        *(undefined8 *)((long)&(pnVar5->m_backend).data + lVar20 * 4) =
             *(undefined8 *)&pnVar5[lVar25].m_backend.fpclass;
        rStatus->data[uVar24 - 2] = rStatus->data[lVar25];
      }
      uVar24 = uVar24 - 1;
      lVar20 = lVar20 + -0xe;
    } while (1 < uVar24);
  }
  iVar18 = (this->m_scale).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar18) {
    lVar25 = 0;
    lVar20 = 0;
    do {
      pNVar6 = (this->m_scale).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar25) != this->m_i) {
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 10;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems._24_5_ = 0;
        local_b8.data._M_elems[7]._1_3_ = 0;
        local_b8.data._M_elems._32_5_ = 0;
        local_b8.data._M_elems[9]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_b8,
                   &(s->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(pNVar6->val).m_backend.data._M_elems + lVar25));
        iVar18 = *(int *)((long)(&((this->m_scale).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val + 1) + lVar25);
        pnVar5 = (s->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pnVar5[iVar18].m_backend.data + 0x20) =
             CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&pnVar5[iVar18].m_backend.data + 0x10);
        *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
        pnVar4 = pnVar5 + iVar18;
        (pnVar4->m_backend).data._M_elems[0] = local_b8.data._M_elems[0];
        *(uint *)((long)&(pnVar4->m_backend).data + 4) = local_b8.data._M_elems[1];
        *(uint *)((long)&(pnVar4->m_backend).data + 8) = local_b8.data._M_elems[2];
        *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = local_b8.data._M_elems[3];
        pnVar5[iVar18].m_backend.exp = local_b8.exp;
        pnVar5[iVar18].m_backend.neg = local_b8.neg;
        pnVar5[iVar18].m_backend.fpclass = local_b8.fpclass;
        pnVar5[iVar18].m_backend.prec_elem = local_b8.prec_elem;
        iVar18 = (this->m_scale).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar20 = lVar20 + 1;
      lVar25 = lVar25 + 0x3c;
    } while (lVar20 < iVar18);
    if (0 < iVar18) {
      local_38 = &this->m_i_rowObj;
      pVVar22 = rStatus->data;
      lVar25 = 0;
      lVar20 = 0;
      bVar9 = 0;
      do {
        pNVar6 = (this->m_scale).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar18 = *(int *)((long)(&pNVar6->val + 1) + lVar25);
        iVar19 = this->m_i;
        VVar23 = pVVar22[iVar19];
        if ((VVar23 == BASIC) || ((bool)(iVar18 != iVar19 & bVar9))) {
LAB_0030a7f8:
          pNVar6 = (this->m_rowObj).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pnVar5 = (y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pnVar5[iVar18].m_backend.data + 0x20) =
               *(undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar25 + 0x20);
          puVar1 = (undefined4 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar25);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          uVar12 = puVar1[2];
          uVar13 = puVar1[3];
          puVar3 = (undefined8 *)((long)(pNVar6->val).m_backend.data._M_elems + lVar25 + 0x10);
          uVar7 = puVar3[1];
          puVar2 = (uint *)((long)&pnVar5[iVar18].m_backend.data + 0x10);
          *(undefined8 *)puVar2 = *puVar3;
          *(undefined8 *)(puVar2 + 2) = uVar7;
          pnVar4 = pnVar5 + iVar18;
          (pnVar4->m_backend).data._M_elems[0] = uVar10;
          *(uint *)((long)&(pnVar4->m_backend).data + 4) = uVar11;
          *(uint *)((long)&(pnVar4->m_backend).data + 8) = uVar12;
          *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = uVar13;
          pnVar5[iVar18].m_backend.exp =
               *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar25);
          pnVar5[iVar18].m_backend.neg =
               *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar25 + 4);
          uVar7 = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar25 + 8);
          pnVar5[iVar18].m_backend.fpclass = (int)uVar7;
          pnVar5[iVar18].m_backend.prec_elem = (int)((ulong)uVar7 >> 0x20);
          pVVar22 = rStatus->data;
          pVVar26 = pVVar22 + iVar18;
LAB_0030a84a:
          *pVVar26 = BASIC;
        }
        else if (VVar23 == FIXED) {
          if ((iVar18 == this->m_maxLhsIdx) || (iVar18 == this->m_minRhsIdx)) {
            pcVar21 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
            pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar25);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar28 = pcVar21;
            if ((pcVar27 != &local_b8) && (pcVar28 = pcVar27, &local_b8 != pcVar21)) {
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
              local_b8.data._M_elems._32_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.data._M_elems._0_8_ =
                   *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems
              ;
              local_b8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
              local_b8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
              local_b8.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.exp = pcVar21->exp;
              local_b8.neg = pcVar21->neg;
              local_b8.fpclass = pcVar21->fpclass;
              local_b8.prec_elem = pcVar21->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar28);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar18].m_backend.data = local_b8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar18].m_backend.data + 8) = local_b8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar18].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar4[iVar18].m_backend.data + 0x20) =
                 CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
            pnVar4[iVar18].m_backend.exp = local_b8.exp;
            pnVar4[iVar18].m_backend.neg = local_b8.neg;
            pnVar4[iVar18].m_backend.fpclass = local_b8.fpclass;
            pnVar4[iVar18].m_backend.prec_elem = local_b8.prec_elem;
            iVar19 = this->m_i;
            pnVar5 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pnVar5[iVar19].m_backend.data + 0x20) =
                 *(undefined8 *)((local_38->m_backend).data._M_elems + 8);
            uVar11 = (local_38->m_backend).data._M_elems[0];
            uVar12 = (local_38->m_backend).data._M_elems[1];
            uVar13 = (local_38->m_backend).data._M_elems[2];
            uVar14 = (local_38->m_backend).data._M_elems[3];
            uVar7 = *(undefined8 *)((local_38->m_backend).data._M_elems + 6);
            puVar2 = (uint *)((long)&pnVar5[iVar19].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = *(undefined8 *)((local_38->m_backend).data._M_elems + 4);
            *(undefined8 *)(puVar2 + 2) = uVar7;
            pnVar4 = pnVar5 + iVar19;
            (pnVar4->m_backend).data._M_elems[0] = uVar11;
            *(uint *)((long)&(pnVar4->m_backend).data + 4) = uVar12;
            *(uint *)((long)&(pnVar4->m_backend).data + 8) = uVar13;
            *(uint *)((long)&(pnVar4->m_backend).data + 0xc) = uVar14;
            pnVar5[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar5[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar5[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar5[iVar19].m_backend.prec_elem = iVar17;
            if ((this->m_isLhsEqualRhs).data[lVar20] == true) {
              pVVar22 = rStatus->data;
              pVVar22[iVar18] = FIXED;
            }
            else {
              if (iVar18 == this->m_maxLhsIdx) {
                pNVar8 = (this->m_scale).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)((long)(pNVar8->val).m_backend.data._M_elems + lVar25);
                local_78.val.m_backend.fpclass = cpp_dec_float_finite;
                local_78.val.m_backend.prec_elem = 10;
                local_78.val.m_backend.data._M_elems[0] = 0;
                local_78.val.m_backend.data._M_elems[1] = 0;
                local_78.val.m_backend.data._M_elems[2] = 0;
                local_78.val.m_backend.data._M_elems[3] = 0;
                local_78.val.m_backend.data._M_elems[4] = 0;
                local_78.val.m_backend.data._M_elems[5] = 0;
                local_78.val.m_backend.data._M_elems._24_5_ = 0;
                local_78.val.m_backend.data._M_elems[7]._1_3_ = 0;
                local_78.val.m_backend.data._M_elems._32_5_ = 0;
                local_78.val.m_backend.data._M_elems[9]._1_3_ = 0;
                local_78.val.m_backend.exp = 0;
                local_78.val.m_backend.neg = false;
                pNVar29 = pNVar6;
                if ((&local_78 != pNVar8) && (pNVar29 = pNVar8, pNVar6 != &local_78)) {
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
                  local_78.val.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                  local_78.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28)
                  ;
                  local_78.val.m_backend.data._M_elems._0_8_ =
                       *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
                  local_78.val.m_backend.data._M_elems._8_8_ =
                       *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
                  local_78.val.m_backend.data._M_elems._16_8_ =
                       *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
                  local_78.val.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                  local_78.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28)
                  ;
                  local_78.val.m_backend.exp =
                       *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25);
                  local_78.val.m_backend.neg =
                       *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 4);
                  local_78.val.m_backend._48_8_ =
                       *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)&local_78,
                           (cpp_dec_float<50U,_int,_void> *)pNVar29);
                VVar23 = ON_UPPER;
                if (local_78.val.m_backend.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)&local_78,&local_b8);
                  VVar23 = (VarStatus)(0 < iVar19);
                }
              }
              else {
                pNVar8 = (this->m_scale).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)((long)(pNVar8->val).m_backend.data._M_elems + lVar25);
                local_78.val.m_backend.fpclass = cpp_dec_float_finite;
                local_78.val.m_backend.prec_elem = 10;
                local_78.val.m_backend.data._M_elems[0] = 0;
                local_78.val.m_backend.data._M_elems[1] = 0;
                local_78.val.m_backend.data._M_elems[2] = 0;
                local_78.val.m_backend.data._M_elems[3] = 0;
                local_78.val.m_backend.data._M_elems[4] = 0;
                local_78.val.m_backend.data._M_elems[5] = 0;
                local_78.val.m_backend.data._M_elems._24_5_ = 0;
                local_78.val.m_backend.data._M_elems[7]._1_3_ = 0;
                local_78.val.m_backend.data._M_elems._32_5_ = 0;
                local_78.val.m_backend.data._M_elems[9]._1_3_ = 0;
                local_78.val.m_backend.exp = 0;
                local_78.val.m_backend.neg = false;
                pNVar29 = pNVar6;
                if ((&local_78 != pNVar8) && (pNVar29 = pNVar8, pNVar6 != &local_78)) {
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
                  local_78.val.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
                  local_78.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28)
                  ;
                  local_78.val.m_backend.data._M_elems._0_8_ =
                       *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
                  local_78.val.m_backend.data._M_elems._8_8_ =
                       *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
                  local_78.val.m_backend.data._M_elems._16_8_ =
                       *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
                  uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
                  local_78.val.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
                  local_78.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28)
                  ;
                  local_78.val.m_backend.exp =
                       *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25);
                  local_78.val.m_backend.neg =
                       *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 4);
                  local_78.val.m_backend._48_8_ =
                       *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 8);
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)&local_78,
                           (cpp_dec_float<50U,_int,_void> *)pNVar29);
                VVar23 = ON_LOWER;
                if (local_78.val.m_backend.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)&local_78,&local_b8);
                  VVar23 = (VarStatus)(iVar19 < 1);
                }
              }
              pVVar22 = rStatus->data;
              pVVar22[iVar18] = VVar23;
            }
            iVar19 = this->m_i;
            goto joined_r0x0030ae4d;
          }
LAB_0030a889:
          if (iVar18 != iVar19) goto LAB_0030a7f8;
        }
        else {
          if ((VVar23 == ON_LOWER) && (iVar18 == this->m_maxLhsIdx)) {
            pcVar21 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
            pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar25);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar28 = pcVar21;
            if ((pcVar27 != &local_b8) && (pcVar28 = pcVar27, &local_b8 != pcVar21)) {
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
              local_b8.data._M_elems._32_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.data._M_elems._0_8_ =
                   *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems
              ;
              local_b8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
              local_b8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
              local_b8.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.exp = pcVar21->exp;
              local_b8.neg = pcVar21->neg;
              local_b8.fpclass = pcVar21->fpclass;
              local_b8.prec_elem = pcVar21->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar28);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar18].m_backend.data = local_b8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar18].m_backend.data + 8) = local_b8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar18].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar4[iVar18].m_backend.data + 0x20) =
                 CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
            pnVar4[iVar18].m_backend.exp = local_b8.exp;
            pnVar4[iVar18].m_backend.neg = local_b8.neg;
            pnVar4[iVar18].m_backend.fpclass = local_b8.fpclass;
            pnVar4[iVar18].m_backend.prec_elem = local_b8.prec_elem;
            iVar19 = this->m_i;
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pnVar4[iVar19].m_backend.data + 0x20) =
                 *(undefined8 *)((local_38->m_backend).data._M_elems + 8);
            uVar7 = *(undefined8 *)(local_38->m_backend).data._M_elems;
            uVar15 = *(undefined8 *)((local_38->m_backend).data._M_elems + 2);
            uVar16 = *(undefined8 *)((local_38->m_backend).data._M_elems + 6);
            puVar2 = (uint *)((long)&pnVar4[iVar19].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = *(undefined8 *)((local_38->m_backend).data._M_elems + 4);
            *(undefined8 *)(puVar2 + 2) = uVar16;
            *(undefined8 *)&pnVar4[iVar19].m_backend.data = uVar7;
            *(undefined8 *)((long)&pnVar4[iVar19].m_backend.data + 8) = uVar15;
            pnVar4[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar4[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar4[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar4[iVar19].m_backend.prec_elem = iVar17;
            pNVar8 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar8->val).m_backend.data._M_elems + lVar25);
            local_78.val.m_backend.fpclass = cpp_dec_float_finite;
            local_78.val.m_backend.prec_elem = 10;
            local_78.val.m_backend.data._M_elems[0] = 0;
            local_78.val.m_backend.data._M_elems[1] = 0;
            local_78.val.m_backend.data._M_elems[2] = 0;
            local_78.val.m_backend.data._M_elems[3] = 0;
            local_78.val.m_backend.data._M_elems[4] = 0;
            local_78.val.m_backend.data._M_elems[5] = 0;
            local_78.val.m_backend.data._M_elems._24_5_ = 0;
            local_78.val.m_backend.data._M_elems[7]._1_3_ = 0;
            local_78.val.m_backend.data._M_elems._32_5_ = 0;
            local_78.val.m_backend.data._M_elems[9]._1_3_ = 0;
            local_78.val.m_backend.exp = 0;
            local_78.val.m_backend.neg = false;
            pNVar29 = pNVar6;
            if ((&local_78 != pNVar8) && (pNVar29 = pNVar8, pNVar6 != &local_78)) {
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
              local_78.val.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
              local_78.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
              local_78.val.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
              local_78.val.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
              local_78.val.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.val.m_backend.exp =
                   *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25);
              local_78.val.m_backend.neg =
                   *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 4);
              local_78.val.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_78,
                       (cpp_dec_float<50U,_int,_void> *)pNVar29);
            VVar23 = ON_UPPER;
            if (local_78.val.m_backend.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_78,&local_b8);
              VVar23 = (VarStatus)(0 < iVar19);
            }
          }
          else {
            if ((VVar23 != ON_UPPER) || (iVar18 != this->m_minRhsIdx)) goto LAB_0030a889;
            pcVar21 = &(y->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar19].m_backend;
            pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)(pNVar6->val).m_backend.data._M_elems + lVar25);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar28 = pcVar21;
            if ((pcVar27 != &local_b8) && (pcVar28 = pcVar27, &local_b8 != pcVar21)) {
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 8);
              local_b8.data._M_elems._32_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.data._M_elems._0_8_ =
                   *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems
              ;
              local_b8.data._M_elems._8_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 2);
              local_b8.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 4);
              uVar7 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar21->data)->data)._M_elems + 6);
              local_b8.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_b8.exp = pcVar21->exp;
              local_b8.neg = pcVar21->neg;
              local_b8.fpclass = pcVar21->fpclass;
              local_b8.prec_elem = pcVar21->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar28);
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)&pnVar4[iVar18].m_backend.data = local_b8.data._M_elems._0_8_;
            *(undefined8 *)((long)&pnVar4[iVar18].m_backend.data + 8) = local_b8.data._M_elems._8_8_
            ;
            puVar2 = (uint *)((long)&pnVar4[iVar18].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = local_b8.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_b8.data._M_elems[7]._1_3_,local_b8.data._M_elems._24_5_);
            *(ulong *)((long)&pnVar4[iVar18].m_backend.data + 0x20) =
                 CONCAT35(local_b8.data._M_elems[9]._1_3_,local_b8.data._M_elems._32_5_);
            pnVar4[iVar18].m_backend.exp = local_b8.exp;
            pnVar4[iVar18].m_backend.neg = local_b8.neg;
            pnVar4[iVar18].m_backend.fpclass = local_b8.fpclass;
            pnVar4[iVar18].m_backend.prec_elem = local_b8.prec_elem;
            iVar19 = this->m_i;
            pnVar4 = (y->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pnVar4[iVar19].m_backend.data + 0x20) =
                 *(undefined8 *)((local_38->m_backend).data._M_elems + 8);
            uVar7 = *(undefined8 *)(local_38->m_backend).data._M_elems;
            uVar15 = *(undefined8 *)((local_38->m_backend).data._M_elems + 2);
            uVar16 = *(undefined8 *)((local_38->m_backend).data._M_elems + 6);
            puVar2 = (uint *)((long)&pnVar4[iVar19].m_backend.data + 0x10);
            *(undefined8 *)puVar2 = *(undefined8 *)((local_38->m_backend).data._M_elems + 4);
            *(undefined8 *)(puVar2 + 2) = uVar16;
            *(undefined8 *)&pnVar4[iVar19].m_backend.data = uVar7;
            *(undefined8 *)((long)&pnVar4[iVar19].m_backend.data + 8) = uVar15;
            pnVar4[iVar19].m_backend.exp = (this->m_i_rowObj).m_backend.exp;
            pnVar4[iVar19].m_backend.neg = (this->m_i_rowObj).m_backend.neg;
            iVar17 = (this->m_i_rowObj).m_backend.prec_elem;
            pnVar4[iVar19].m_backend.fpclass = (this->m_i_rowObj).m_backend.fpclass;
            pnVar4[iVar19].m_backend.prec_elem = iVar17;
            pNVar8 = (this->m_scale).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar6 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)((long)(pNVar8->val).m_backend.data._M_elems + lVar25);
            local_78.val.m_backend.fpclass = cpp_dec_float_finite;
            local_78.val.m_backend.prec_elem = 10;
            local_78.val.m_backend.data._M_elems[0] = 0;
            local_78.val.m_backend.data._M_elems[1] = 0;
            local_78.val.m_backend.data._M_elems[2] = 0;
            local_78.val.m_backend.data._M_elems[3] = 0;
            local_78.val.m_backend.data._M_elems[4] = 0;
            local_78.val.m_backend.data._M_elems[5] = 0;
            local_78.val.m_backend.data._M_elems._24_5_ = 0;
            local_78.val.m_backend.data._M_elems[7]._1_3_ = 0;
            local_78.val.m_backend.data._M_elems._32_5_ = 0;
            local_78.val.m_backend.data._M_elems[9]._1_3_ = 0;
            local_78.val.m_backend.exp = 0;
            local_78.val.m_backend.neg = false;
            pNVar29 = pNVar6;
            if ((&local_78 != pNVar8) && (pNVar29 = pNVar8, pNVar6 != &local_78)) {
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 8);
              local_78.val.m_backend.data._M_elems._32_5_ = SUB85(uVar7,0);
              local_78.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.val.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)(pNVar6->val).m_backend.data._M_elems;
              local_78.val.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 2);
              local_78.val.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 4);
              uVar7 = *(undefined8 *)((pNVar6->val).m_backend.data._M_elems + 6);
              local_78.val.m_backend.data._M_elems._24_5_ = SUB85(uVar7,0);
              local_78.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
              local_78.val.m_backend.exp =
                   *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25);
              local_78.val.m_backend.neg =
                   *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 4);
              local_78.val.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar25 + 8);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      ((cpp_dec_float<50U,_int,_void> *)&local_78,
                       (cpp_dec_float<50U,_int,_void> *)pNVar29);
            VVar23 = ON_LOWER;
            if (local_78.val.m_backend.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_b8,0,(type *)0x0);
              iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)&local_78,&local_b8);
              VVar23 = (VarStatus)(iVar19 < 1);
            }
          }
          pVVar22 = rStatus->data;
          pVVar22[iVar18] = VVar23;
          iVar19 = this->m_i;
joined_r0x0030ae4d:
          bVar9 = 1;
          if (iVar18 != iVar19) {
            pVVar26 = pVVar22 + iVar19;
            bVar9 = 1;
            goto LAB_0030a84a;
          }
        }
        lVar20 = lVar20 + 1;
        lVar25 = lVar25 + 0x3c;
      } while (lVar20 < (this->m_scale).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateRowsPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the duplicated rows:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int rIdx_new = m_perm[i];
            int rIdx = i;
            s[rIdx] = s[rIdx_new];
            y[rIdx] = y[rIdx_new];
            rStatus[rIdx] = rStatus[rIdx_new];
         }
      }
   }

   // primal:
   for(int k = 0; k < m_scale.size(); ++k)
   {
      if(m_scale.index(k) != m_i)
         s[m_scale.index(k)] = s[m_i] / m_scale.value(k);
   }

   // dual & basis:
   bool haveSetBasis = false;

   for(int k = 0; k < m_scale.size(); ++k)
   {
      int i = m_scale.index(k);

      if(rStatus[m_i] == SPxSolverBase<R>::BASIC || (haveSetBasis && i != m_i))
         // if the row with tightest lower and upper bound in the basic, every duplicate row should in basic
         // or basis status of row m_i has been set, this row should be in basis
      {
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
         continue;
      }

      SOPLEX_ASSERT_WARN("WMAISM02", isNotZero(m_scale.value(k), this->epsilon()));

      if(rStatus[m_i] == SPxSolverBase<R>::FIXED && (i == m_maxLhsIdx || i == m_minRhsIdx))
      {
         // this row leads to the tightest lower or upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         if(m_isLhsEqualRhs[k])
         {
            rStatus[i] = SPxSolverBase<R>::FIXED;
         }
         else if(i == m_maxLhsIdx)
         {
            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                         SPxSolverBase<R>::ON_UPPER;
         }
         else
         {
            assert(i == m_minRhsIdx);

            rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                         SPxSolverBase<R>::ON_LOWER;
         }

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_maxLhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
      {
         // this row leads to the tightest lower bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_LOWER :
                      SPxSolverBase<R>::ON_UPPER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i == m_minRhsIdx && rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
      {
         // this row leads to the tightest upper bound, slack should not be in the basis
         y[i]   = y[m_i] * m_scale.value(k);
         y[m_i] = m_i_rowObj;

         rStatus[i] = m_scale.value(k) * m_scale.value(0) > 0 ? SPxSolverBase<R>::ON_UPPER :
                      SPxSolverBase<R>::ON_LOWER;

         if(i != m_i)
            rStatus[m_i] = SPxSolverBase<R>::BASIC;

         haveSetBasis = true;
      }
      else if(i != m_i)
      {
         // this row does not lead to the tightest lower or upper bound, slack should be in the basis
         y[i]       = m_rowObj.value(k);
         rStatus[i] = SPxSolverBase<R>::BASIC;
      }
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_isFirst && !this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM24 Dimension doesn't match after this step.");
   }

#endif

   // nothing to do for the reduced cost values
}